

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

ComponentPtr __thiscall libcellml::AnyCellmlElement::component(AnyCellmlElement *this)

{
  AnyCellmlElementImpl *pAVar1;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  ComponentPtr CVar3;
  
  if (*(uint *)*in_RSI < 2) {
    puVar2 = (undefined8 *)
             std::__any_caster<std::shared_ptr<libcellml::Component>>((any *)((uint *)*in_RSI + 2));
    if (puVar2 == (undefined8 *)0x0) {
      std::__throw_bad_any_cast();
    }
    this->mPimpl = (AnyCellmlElementImpl *)*puVar2;
    pAVar1 = (AnyCellmlElementImpl *)puVar2[1];
    this[1].mPimpl = pAVar1;
    in_RDX._M_pi = extraout_RDX;
    if (pAVar1 != (AnyCellmlElementImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(pAVar1->mItem)._M_manager = *(int *)&(pAVar1->mItem)._M_manager + 1;
        UNLOCK();
      }
      else {
        *(int *)&(pAVar1->mItem)._M_manager = *(int *)&(pAVar1->mItem)._M_manager + 1;
      }
    }
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar3.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr AnyCellmlElement::component() const
{
    if ((mPimpl->mType == CellmlElementType::COMPONENT)
        || (mPimpl->mType == CellmlElementType::COMPONENT_REF)) {
        try {
            return std::any_cast<ComponentPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}